

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O2

void __thiscall QTemporaryDirPrivate::create(QTemporaryDirPrivate *this,QString *templateName)

{
  long lVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char> local_c0;
  QTemporaryFileName local_a8;
  QFileSystemEntry fileSystemEntry;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QTemporaryFileName::QTemporaryFileName(&local_a8,templateName);
  iVar7 = 0x101;
  do {
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) break;
    QTemporaryFileName::generateNext((NativePath *)&local_c0,&local_a8);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_c0);
    fileSystemEntry._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    fileSystemEntry.m_nativeFilePath.d.ptr._0_4_ = 0xaaaaaaaa;
    fileSystemEntry.m_nativeFilePath.d.ptr._4_4_ = 0xaaaaaaaa;
    fileSystemEntry.m_nativeFilePath.d.size._0_4_ = 0xaaaaaaaa;
    fileSystemEntry.m_nativeFilePath.d.size._4_4_ = 0xaaaaaaaa;
    fileSystemEntry.m_filePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    fileSystemEntry.m_nativeFilePath.d.d._0_4_ = 0xaaaaaaaa;
    fileSystemEntry.m_nativeFilePath.d.d._4_4_ = 0xaaaaaaaa;
    fileSystemEntry.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    fileSystemEntry.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry(&fileSystemEntry,&local_a8);
    iVar5 = QFileSystemEngine::mkdir((char *)&fileSystemEntry,0x7000);
    if ((char)iVar5 != '\0') {
      this->success = true;
      QFileSystemEntry::filePath((QString *)&local_d8,&fileSystemEntry);
      pDVar3 = (this->pathOrError).d.d;
      pcVar4 = (this->pathOrError).d.ptr;
      (this->pathOrError).d.d = local_d8.d;
      (this->pathOrError).d.ptr = local_d8.ptr;
      qVar2 = (this->pathOrError).d.size;
      (this->pathOrError).d.size = local_d8.size;
      local_d8.d = pDVar3;
      local_d8.ptr = pcVar4;
      local_d8.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QFileSystemEntry::~QFileSystemEntry(&fileSystemEntry);
      goto LAB_0023c9d0;
    }
    piVar6 = __errno_location();
    iVar5 = *piVar6;
    QFileSystemEntry::~QFileSystemEntry(&fileSystemEntry);
  } while (iVar5 == 0x11);
  qt_error_string(&fileSystemEntry.m_filePath,-1);
  pDVar3 = (this->pathOrError).d.d;
  pcVar4 = (this->pathOrError).d.ptr;
  (this->pathOrError).d.d = fileSystemEntry.m_filePath.d.d;
  (this->pathOrError).d.ptr = fileSystemEntry.m_filePath.d.ptr;
  qVar2 = (this->pathOrError).d.size;
  (this->pathOrError).d.size = fileSystemEntry.m_filePath.d.size;
  fileSystemEntry.m_filePath.d.d = pDVar3;
  fileSystemEntry.m_filePath.d.ptr = pcVar4;
  fileSystemEntry.m_filePath.d.size = qVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fileSystemEntry);
  this->success = false;
LAB_0023c9d0:
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTemporaryDirPrivate::create(const QString &templateName)
{
    QTemporaryFileName tfn(templateName);
    constexpr auto perms = QFile::ReadOwner | QFile::WriteOwner | QFile::ExeOwner;
    for (int i = 0; i < 256; ++i) {
        tfn.generateNext();
        QFileSystemEntry fileSystemEntry(tfn.path, QFileSystemEntry::FromNativePath());
        if (QFileSystemEngine::mkdir(fileSystemEntry, perms)) {
            success = true;
            pathOrError = fileSystemEntry.filePath();
            return;
        }
#  ifdef Q_OS_WIN
        const int exists = ERROR_ALREADY_EXISTS;
        int code = GetLastError();
#  else
        const int exists = EEXIST;
        int code = errno;
#  endif
        if (code != exists)
            break;
    }
    pathOrError = qt_error_string();
    success = false;
}